

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall
ObjectModelBuilder::buildBindingDependency
          (ObjectModelBuilder *this,Binding *binding,string *dep,Object *object,Class *clazz)

{
  size_type *psVar1;
  string *__return_storage_ptr__;
  pointer pPVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  pointer pPVar8;
  bool bVar9;
  bool bVar10;
  undefined1 local_d8 [8];
  Dependency d;
  string dependency;
  Property i;
  
  __return_storage_ptr__ = (string *)(d.objectId.field_2._M_local_buf + 8);
  string_trim(__return_storage_ptr__,dep);
  lVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x11cef2,0);
  local_d8 = (undefined1  [8])&d.propertyName._M_string_length;
  d.propertyName._M_dataplus._M_p = (pointer)0x0;
  d.propertyName._M_string_length._0_1_ = 0;
  d.propertyName.field_2._8_8_ = &d.objectId._M_string_length;
  d.objectId._M_dataplus._M_p = (pointer)0x0;
  d.objectId._M_string_length._0_1_ = 0;
  if (lVar5 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"didn\'t find any match..",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    pPVar8 = (object->clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (object->clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar8 != pPVar2) {
      bVar9 = false;
      do {
        dependency.field_2._8_8_ = pPVar8->clazz;
        i.clazz = (Class *)&i.name._M_string_length;
        pcVar3 = (pPVar8->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&i,pcVar3,pcVar3 + (pPVar8->name)._M_string_length);
        i.name.field_2._8_8_ = &i.type._M_string_length;
        pcVar3 = (pPVar8->type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&i.name.field_2 + 8),pcVar3,
                   pcVar3 + (pPVar8->type)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"looking object, matching ",0x19);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)d.objectId.field_2._8_8_,
                            (long)dependency._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((i.name._M_dataplus._M_p == dependency._M_dataplus._M_p) &&
           ((i.name._M_dataplus._M_p == (pointer)0x0 ||
            (iVar4 = bcmp(i.clazz,(void *)d.objectId.field_2._8_8_,(size_t)i.name._M_dataplus._M_p),
            iVar4 == 0)))) {
          std::__cxx11::string::_M_assign((string *)(d.propertyName.field_2._M_local_buf + 8));
          bVar10 = true;
          std::__cxx11::string::_M_assign((string *)local_d8);
          bVar9 = true;
        }
        else {
          bVar10 = false;
        }
        if ((size_type *)i.name.field_2._8_8_ != &i.type._M_string_length) {
          operator_delete((void *)i.name.field_2._8_8_);
        }
        if (i.clazz != (Class *)&i.name._M_string_length) {
          operator_delete(i.clazz);
        }
        pPVar8 = pPVar8 + 1;
      } while (!bVar10 && pPVar8 != pPVar2);
      if (bVar9) goto LAB_0010fdd2;
    }
    pPVar8 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar2 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar8 != pPVar2) {
      psVar1 = &i.type._M_string_length;
      do {
        dependency.field_2._8_8_ = pPVar8->clazz;
        i.clazz = (Class *)&i.name._M_string_length;
        pcVar3 = (pPVar8->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&i,pcVar3,pcVar3 + (pPVar8->name)._M_string_length);
        pcVar3 = (pPVar8->type)._M_dataplus._M_p;
        i.name.field_2._8_8_ = psVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&i.name.field_2 + 8),pcVar3,
                   pcVar3 + (pPVar8->type)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"looking class, matching ",0x18);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)i.clazz,(long)i.name._M_dataplus._M_p);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)d.objectId.field_2._8_8_,
                            (long)dependency._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((i.name._M_dataplus._M_p == dependency._M_dataplus._M_p) &&
           ((i.name._M_dataplus._M_p == (pointer)0x0 ||
            (iVar4 = bcmp(i.clazz,(void *)d.objectId.field_2._8_8_,(size_t)i.name._M_dataplus._M_p),
            iVar4 == 0)))) {
          std::__cxx11::string::_M_replace
                    ((ulong)((long)&d.propertyName.field_2 + 8),0,d.objectId._M_dataplus._M_p,
                     0x11c65a);
          std::__cxx11::string::_M_assign((string *)local_d8);
          if ((size_type *)i.name.field_2._8_8_ != psVar1) {
            operator_delete((void *)i.name.field_2._8_8_);
          }
          uVar7 = i.clazz;
          if (i.clazz != (Class *)&i.name._M_string_length) goto LAB_0010faa2;
          break;
        }
        if ((size_type *)i.name.field_2._8_8_ != psVar1) {
          operator_delete((void *)i.name.field_2._8_8_);
        }
        if (i.clazz != (Class *)&i.name._M_string_length) {
          operator_delete(i.clazz);
        }
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != pPVar2);
    }
  }
  else {
    std::__cxx11::string::substr
              ((ulong)((long)&dependency.field_2 + 8),(ulong)((long)&d.objectId.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(d.propertyName.field_2._M_local_buf + 8),
               (string *)(dependency.field_2._M_local_buf + 8));
    if ((string *)dependency.field_2._8_8_ != &i.name) {
      operator_delete((void *)dependency.field_2._8_8_);
    }
    std::__cxx11::string::substr
              ((ulong)((long)&dependency.field_2 + 8),(ulong)((long)&d.objectId.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)local_d8,(string *)(dependency.field_2._M_local_buf + 8));
    uVar7 = dependency.field_2._8_8_;
    if ((string *)dependency.field_2._8_8_ != &i.name) {
LAB_0010faa2:
      operator_delete((void *)uVar7);
    }
  }
LAB_0010fdd2:
  bVar9 = d.objectId._M_dataplus._M_p != (pointer)0x0;
  bVar10 = d.propertyName._M_dataplus._M_p != (pointer)0x0;
  if (bVar10 && bVar9) {
    std::vector<Binding::Dependency,_std::allocator<Binding::Dependency>_>::push_back
              (&binding->dependencies,(value_type *)local_d8);
  }
  if ((size_type *)d.propertyName.field_2._8_8_ != &d.objectId._M_string_length) {
    operator_delete((void *)d.propertyName.field_2._8_8_);
  }
  if (local_d8 != (undefined1  [8])&d.propertyName._M_string_length) {
    operator_delete((void *)local_d8);
  }
  if ((size_type *)d.objectId.field_2._8_8_ != &dependency._M_string_length) {
    operator_delete((void *)d.objectId.field_2._8_8_);
  }
  return bVar10 && bVar9;
}

Assistant:

bool ObjectModelBuilder::buildBindingDependency(Binding *binding, const std::string &dep, Object *object, Class *clazz)
{
    // parse out "objectId->propertyName" and add as a Binding::Depencency to the Binding
    std::string dependency = string_trim(dep);
    size_t pos = dependency.find("->");

    Binding::Dependency d;

    // If we didn't find a ->, look in the class we're generating to see if the
    // binding matches that..
    if (pos == std::string::npos) {
        std::cout << "didn't find any match.." << std::endl;
        bool propertyInInstance = false;
        for (auto i : object->clazz->properties) {
            std::cout << "looking object, matching " << i.name << dependency << std::endl;
            if (i.name == dependency) {
                propertyInInstance = true;
                d.objectId = object->id;
                d.propertyName = dependency;
                break;
            }
        }
        if (!propertyInInstance) {
            for (auto i : clazz->properties) {
                std::cout << "looking class, matching " << i.name << dependency << std::endl;
                if (i.name == dependency) {
                    d.objectId = "this"; // refers to the instance of the class being generated
                    d.propertyName = dependency;
                    break;
                }
            }
        }
    } else {
        d.objectId = dependency.substr(0, pos);
        d.propertyName = dependency.substr(pos + 2);
    }
    if (d.objectId.empty() || d.propertyName.empty())
        return false;
    binding->dependencies.push_back(d);
    return true;
}